

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrecord.cpp
# Opt level: O0

void __thiscall QSqlRecord::clearValues(QSqlRecord *this)

{
  bool bVar1;
  iterator o;
  QSqlField *in_RDI;
  long in_FS_OFFSET;
  QSqlField *f;
  QList<QSqlField> *__range1;
  iterator __end1;
  iterator __begin1;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QSqlRecord *)0x13c3ba);
  QExplicitlySharedDataPointer<QSqlRecordPrivate>::operator->
            ((QExplicitlySharedDataPointer<QSqlRecordPrivate> *)0x13c3d3);
  local_10.i = (QSqlField *)0xaaaaaaaaaaaaaaaa;
  local_10 = QList<QSqlField>::begin(in_RDI);
  o = QList<QSqlField>::end(in_RDI);
  while( true ) {
    bVar1 = QList<QSqlField>::iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    QList<QSqlField>::iterator::operator*(&local_10);
    QSqlField::clear(in_RDI);
    QList<QSqlField>::iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSqlRecord::clearValues()
{
    detach();
    for (QSqlField &f : d->fields)
        f.clear();
}